

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O1

void __thiscall gl4cts::DirectStateAccess::Queries::FunctionalTest::draw(FunctionalTest *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  long lVar3;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  lVar3 = 0;
  do {
    (**(code **)(lVar2 + 0x20))
              (*(undefined4 *)((long)&s_targets + lVar3),*(undefined4 *)((long)this->m_qo + lVar3));
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  (**(code **)(lVar2 + 0x30))(4);
  lVar3 = 0;
  (**(code **)(lVar2 + 0x538))(5,0,4);
  (**(code **)(lVar2 + 0x638))();
  do {
    (**(code **)(lVar2 + 0x628))(*(undefined4 *)((long)&s_targets + lVar3));
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  (**(code **)(lVar2 + 0x648))();
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"Drawing function have failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x7a5);
  return;
}

Assistant:

void FunctionalTest::draw()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Start queries. */
	for (glw::GLuint i = 0; i < s_targets_count; ++i)
	{
		gl.beginQuery(s_targets[i], m_qo[i]);
	}

	/* Start XFB. */
	gl.beginTransformFeedback(GL_TRIANGLES);

	/* Draw full screen quad. */
	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);

	/* Finish XFB. */
	gl.endTransformFeedback();

	/* Finish queries. */
	for (glw::GLuint i = 0; i < s_targets_count; ++i)
	{
		gl.endQuery(s_targets[i]);
	}

	/* Make sure OpenGL finished drawing. */
	gl.finish();

	/* Error checking. */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Drawing function have failed.");
}